

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlyphBoundaries.cpp
# Opt level: O0

int GlyphBoundaries::OutputToGlatNonexistent(GrcBinaryStream *pbstrm)

{
  undefined8 in_RDI;
  int iOutput;
  
  iOutput = (int)((ulong)in_RDI >> 0x20);
  GrcBinaryStream::WriteShort<int>(pbstrm,iOutput);
  GrcBinaryStream::WriteByte<int>(pbstrm,iOutput);
  GrcBinaryStream::WriteByte<int>(pbstrm,iOutput);
  GrcBinaryStream::WriteByte<int>(pbstrm,iOutput);
  GrcBinaryStream::WriteByte<int>(pbstrm,iOutput);
  return 6;
}

Assistant:

int GlyphBoundaries::OutputToGlatNonexistent(GrcBinaryStream * pbstrm)
{
	// Empty bitmap
	pbstrm->WriteShort(0);
	// 4 bogus diagonals
	pbstrm->WriteByte(0);
	pbstrm->WriteByte(0);
	pbstrm->WriteByte(0);
	pbstrm->WriteByte(0);

	return 6;
}